

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O0

void bb_uses(dill_stream c,basic_block_conflict bb,int vreg)

{
  int iVar1;
  int in_EDX;
  long in_RSI;
  dill_stream in_RDI;
  
  if (99 < in_EDX) {
    iVar1 = bit_vec_is_set(*(bit_vec *)(in_RSI + 0x40),in_EDX + -100);
    if (iVar1 == 0) {
      bit_vec_set(*(bit_vec *)(in_RSI + 0x38),in_EDX + -100);
    }
    set_used(in_RDI,in_EDX);
  }
  return;
}

Assistant:

static void
bb_uses(dill_stream c, basic_block bb, int vreg)
{
    if (vreg >= 100) {
        /* not param */
        if (!bit_vec_is_set(bb->regs_defined, vreg - 100)) {
            bit_vec_set(bb->regs_used, vreg - 100);
        }
        set_used(c, vreg);
    }
}